

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O0

bool bssl::SSL_serialize_handoff(SSL *ssl,CBB *out,SSL_CLIENT_HELLO *out_hello)

{
  SSL3_STATE *pSVar1;
  bool bVar2;
  int iVar3;
  pointer pSVar4;
  uchar *data;
  size_t sVar5;
  pointer pbVar6;
  uint8_t *puVar7;
  undefined1 local_98 [8];
  Span<const_unsigned_char> transcript;
  SSLMessage msg;
  CBB seq;
  SSL3_STATE *s3;
  SSL_CLIENT_HELLO *out_hello_local;
  CBB *out_local;
  SSL *ssl_local;
  
  pSVar1 = ssl->s3;
  if ((((ssl->field_0xa4 & 1) != 0) && (bVar2 = std::operator==(&pSVar1->hs,(nullptr_t)0x0), !bVar2)
      ) && (pSVar1->rwstate == 0x11)) {
    pSVar4 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&pSVar1->hs);
    _local_98 = SSLTranscript::buffer(&pSVar4->transcript);
    iVar3 = CBB_add_asn1(out,(CBB *)&msg.raw.len,0x20000010);
    if ((iVar3 != 0) && (iVar3 = CBB_add_asn1_uint64((CBB *)&msg.raw.len,0), iVar3 != 0)) {
      data = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_98);
      sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_98);
      iVar3 = CBB_add_asn1_octet_string((CBB *)&msg.raw.len,data,sVar5);
      if (iVar3 != 0) {
        pbVar6 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&pSVar1->hs_buf);
        puVar7 = (uint8_t *)pbVar6->data;
        pbVar6 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&pSVar1->hs_buf);
        iVar3 = CBB_add_asn1_octet_string((CBB *)&msg.raw.len,puVar7,pbVar6->length);
        if (((iVar3 != 0) && (bVar2 = serialize_features((CBB *)&msg.raw.len), bVar2)) &&
           ((iVar3 = CBB_flush(out), iVar3 != 0 &&
            (bVar2 = (*ssl->method->get_message)(ssl,(SSLMessage *)&transcript.size_), bVar2)))) {
          puVar7 = CBS_data((CBS *)&msg);
          sVar5 = CBS_len((CBS *)&msg);
          iVar3 = SSL_parse_client_hello(ssl,out_hello,puVar7,sVar5);
          if (iVar3 != 0) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool SSL_serialize_handoff(const SSL *ssl, CBB *out,
                           SSL_CLIENT_HELLO *out_hello) {
  const SSL3_STATE *const s3 = ssl->s3;
  if (!ssl->server ||       //
      s3->hs == nullptr ||  //
      s3->rwstate != SSL_ERROR_HANDOFF) {
    return false;
  }

  CBB seq;
  SSLMessage msg;
  Span<const uint8_t> transcript = s3->hs->transcript.buffer();

  if (!CBB_add_asn1(out, &seq, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&seq, kHandoffVersion) ||
      !CBB_add_asn1_octet_string(&seq, transcript.data(), transcript.size()) ||
      !CBB_add_asn1_octet_string(&seq,
                                 reinterpret_cast<uint8_t *>(s3->hs_buf->data),
                                 s3->hs_buf->length) ||
      !serialize_features(&seq) || !CBB_flush(out) ||
      !ssl->method->get_message(ssl, &msg) ||
      !SSL_parse_client_hello(ssl, out_hello, CBS_data(&msg.body),
                              CBS_len(&msg.body))) {
    return false;
  }

  return true;
}